

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4-compression.cc
# Opt level: O2

size_t tinyusdz::LZ4Compression::GetCompressedBufferSize(size_t inputSize)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  
  if (inputSize < 0x3e82000001) {
    if (inputSize < 0x7e000001) {
      iVar1 = LZ4_compressBound((int)inputSize);
      lVar2 = (long)iVar1;
    }
    else {
      iVar1 = LZ4_compressBound(0x7e000000);
      lVar2 = ((long)iVar1 + 4) * (inputSize / 0x7e000000);
      if (inputSize % 0x7e000000 != 0) {
        iVar1 = LZ4_compressBound((int)(inputSize % 0x7e000000));
        return lVar2 + iVar1 + 5;
      }
    }
    sVar3 = lVar2 + 1;
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

size_t LZ4Compression::GetCompressedBufferSize(size_t inputSize) {
  if (inputSize > GetMaxInputSize()) return 0;

  // If it fits in one chunk then it's just the compress bound plus 1.
  if (inputSize <= LZ4_MAX_INPUT_SIZE) {
    return size_t(LZ4_compressBound(int(inputSize))) + 1;
  }
  size_t nWholeChunks = inputSize / LZ4_MAX_INPUT_SIZE;
  size_t partChunkSz = inputSize % LZ4_MAX_INPUT_SIZE;
  size_t sz = 1 + nWholeChunks *
                      (size_t(LZ4_compressBound(LZ4_MAX_INPUT_SIZE)) + sizeof(int32_t));
  if (partChunkSz) sz += size_t(LZ4_compressBound(int(partChunkSz))) + sizeof(int32_t);
  return sz;
}